

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

string * QUtil::utf16_to_utf8(string *__return_storage_ptr__,string *val)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  byte *pbVar4;
  unsigned_long extraout_RDX;
  unsigned_long extraout_RDX_00;
  unsigned_long uVar5;
  size_t local_c0;
  size_t local_b8;
  string local_90;
  int local_70;
  unsigned_short local_6a;
  size_t sStack_68;
  unsigned_short bits;
  size_t lsb;
  size_t msb;
  size_t i;
  byte local_39;
  size_t sStack_38;
  bool is_le;
  size_t start;
  size_t len;
  unsigned_long codepoint;
  string *local_18;
  string *val_local;
  string *result;
  
  codepoint._7_1_ = 0;
  local_18 = val;
  val_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  len = 0;
  start = std::__cxx11::string::length();
  sStack_38 = 0;
  local_39 = 0;
  bVar2 = is_utf16(local_18);
  if (bVar2) {
    pcVar3 = (char *)std::__cxx11::string::at((ulong)local_18);
    if (*pcVar3 == -1) {
      local_39 = 1;
    }
    sStack_38 = sStack_38 + 2;
  }
  for (msb = sStack_38; msb + 1 < start; msb = msb + 2) {
    if ((local_39 & 1) == 0) {
      local_b8 = msb;
    }
    else {
      local_b8 = msb + 1;
    }
    lsb = local_b8;
    if ((local_39 & 1) == 0) {
      local_c0 = msb + 1;
    }
    else {
      local_c0 = msb;
    }
    sStack_68 = local_c0;
    pbVar4 = (byte *)std::__cxx11::string::at((ulong)local_18);
    bVar1 = *pbVar4;
    pbVar4 = (byte *)std::__cxx11::string::at((ulong)local_18);
    local_70 = (uint)bVar1 * 0x100 + (uint)*pbVar4;
    local_6a = QIntC::to_ushort<int>(&local_70);
    if ((local_6a & 0xfc00) == 0xd800) {
      len = (size_t)((local_6a & 0x3ff) * 0x400 + 0x10000);
    }
    else {
      uVar5 = extraout_RDX;
      if ((local_6a & 0xfc00) == 0xdc00) {
        if (len != 0) {
          QTC::TC("qpdf","QUtil non-trivial UTF-16",0);
          uVar5 = extraout_RDX_00;
        }
        len = (long)(int)(local_6a & 0x3ff) + len;
      }
      else {
        len = (size_t)local_6a;
      }
      toUTF8_abi_cxx11_(&local_90,(QUtil *)len,uVar5);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      len = 0;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QUtil::utf16_to_utf8(std::string const& val)
{
    std::string result;
    // This code uses unsigned long and unsigned short to hold codepoint values. It requires
    // unsigned long to be at least 32 bits and unsigned short to be at least 16 bits, but it will
    // work fine if they are larger.
    unsigned long codepoint = 0L;
    size_t len = val.length();
    size_t start = 0;
    bool is_le = false;
    if (is_utf16(val)) {
        if (static_cast<unsigned char>(val.at(0)) == 0xff) {
            is_le = true;
        }
        start += 2;
    }
    // If the string has an odd number of bytes, the last byte is ignored.
    for (size_t i = start; i + 1 < len; i += 2) {
        // Convert from UTF16-BE.  If we get a malformed codepoint, this code will generate
        // incorrect output without giving a warning.  Specifically, a high codepoint not followed
        // by a low codepoint will be discarded, and a low codepoint not preceded by a high
        // codepoint will just get its low 10 bits output.
        auto msb = is_le ? i + 1 : i;
        auto lsb = is_le ? i : i + 1;
        unsigned short bits = QIntC::to_ushort(
            (static_cast<unsigned char>(val.at(msb)) << 8) +
            static_cast<unsigned char>(val.at(lsb)));
        if ((bits & 0xFC00) == 0xD800) {
            codepoint = 0x10000U + ((bits & 0x3FFU) << 10U);
            continue;
        } else if ((bits & 0xFC00) == 0xDC00) {
            if (codepoint != 0) {
                QTC::TC("qpdf", "QUtil non-trivial UTF-16");
            }
            codepoint += bits & 0x3FF;
        } else {
            codepoint = bits;
        }

        result += QUtil::toUTF8(codepoint);
        codepoint = 0;
    }
    return result;
}